

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uchar * push_bytes(uchar **cursor,size_t *max,void *src,size_t len)

{
  size_t len_local;
  void *src_local;
  size_t *max_local;
  uchar **cursor_local;
  
  if ((cursor == (uchar **)0x0) || (*cursor == (uchar *)0x0)) {
    *max = len + *max;
    cursor_local = (uchar **)0x0;
  }
  else if (*max < len) {
    if (src != (void *)0x0) {
      memcpy(*cursor,src,*max);
    }
    *max = len - *max;
    *cursor = (uchar *)0x0;
    cursor_local = (uchar **)0x0;
  }
  else {
    if (src != (void *)0x0) {
      memcpy(*cursor,src,len);
    }
    *cursor = *cursor + len;
    *max = *max - len;
    cursor_local = (uchar **)(*cursor + -len);
  }
  return (uchar *)cursor_local;
}

Assistant:

unsigned char *push_bytes(unsigned char **cursor, size_t *max,
                          const void *src, size_t len)
{
    if (cursor == NULL || *cursor == NULL) {
        *max += len;
        return NULL;
    }
    if (len > *max) {
        if (src)
            memcpy(*cursor, src, *max);
        /* From now on, max records the room we *needed* */
        *max = len - *max;
        *cursor = NULL;
        return NULL;
    }
    if (src)
        memcpy(*cursor, src, len);

    *cursor += len;
    *max -= len;

    return *cursor - len;
}